

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

void Gia_ManHashProfile(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int i;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  uVar1 = (p->vHTable).nSize;
  uVar2 = Gia_ManAndNum(p);
  printf("Table size = %d. Entries = %d. ",(ulong)uVar1,(ulong)uVar2);
  printf("Hits = %d. Misses = %d.\n",(ulong)(uint)p->nHashHit,(ulong)(uint)p->nHashMiss);
  iVar3 = (p->vHTable).nSize;
  iVar5 = 1000;
  if (iVar3 < 1000) {
    iVar5 = iVar3;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (iVar3 = 0; iVar3 != iVar5; iVar3 = iVar3 + 1) {
    i = Vec_IntEntry(&p->vHTable,iVar3);
    uVar4 = 0;
    for (; i != 0; i = Vec_IntEntry(&p->vHash,i)) {
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    if ((int)uVar4 != 0) {
      printf("%d ",uVar4);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManHashProfile( Gia_Man_t * p )
{
    int iEntry;
    int i, Counter, Limit;
    printf( "Table size = %d. Entries = %d. ", Vec_IntSize(&p->vHTable), Gia_ManAndNum(p) );
    printf( "Hits = %d. Misses = %d.\n", (int)p->nHashHit, (int)p->nHashMiss );
    Limit = Abc_MinInt( 1000, Vec_IntSize(&p->vHTable) );
    for ( i = 0; i < Limit; i++ )
    {
        Counter = 0;
        for ( iEntry = Vec_IntEntry(&p->vHTable, i); 
              iEntry; 
              iEntry = iEntry? Vec_IntEntry(&p->vHash, iEntry) : 0 )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
    printf( "\n" );
}